

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::js::api::json::UpdateTxInSequenceRequest::ConvertFromStruct
          (UpdateTxInSequenceRequest *this,UpdateTxInSequenceRequestStruct *data)

{
  uint32_t uVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->tx_);
  this->is_elements_ = data->is_elements;
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  uVar1 = data->sequence;
  this->vout_ = data->vout;
  this->sequence_ = uVar1;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void UpdateTxInSequenceRequest::ConvertFromStruct(
    const UpdateTxInSequenceRequestStruct& data) {
  tx_ = data.tx;
  is_elements_ = data.is_elements;
  txid_ = data.txid;
  vout_ = data.vout;
  sequence_ = data.sequence;
  ignore_items = data.ignore_items;
}